

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

void int_linear_imp<0>(vec<int> *a,vec<IntVar_*> *x,IntRelType t,int c,BoolView *r)

{
  LinearGE<0,_1> *pLVar1;
  LinearNE<0,_1,_1> *this;
  undefined8 extraout_RAX;
  ulong uVar2;
  int local_bc;
  vec<int> local_b8;
  BoolView local_a0;
  BoolView local_90;
  BoolView local_80;
  BoolView local_70;
  BoolView local_60;
  BoolView local_50;
  BoolView local_40;
  
  local_b8.sz = 0;
  local_b8.cap = 0;
  local_b8.data = (int *)0x0;
  if (a->sz != 0) {
    uVar2 = 0;
    do {
      local_bc = -a->data[uVar2];
      vec<int>::push(&local_b8,&local_bc);
      uVar2 = uVar2 + 1;
    } while (uVar2 < a->sz);
  }
  switch(t) {
  case IRT_EQ:
    pLVar1 = (LinearGE<0,_1> *)operator_new(0x88);
    local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_40.v = r->v;
    local_40.s = r->s;
    LinearGE<0,_1>::LinearGE(pLVar1,a,x,c,&local_40);
    pLVar1 = (LinearGE<0,_1> *)operator_new(0x88);
    local_50.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_50.v = r->v;
    local_50.s = r->s;
    LinearGE<0,_1>::LinearGE(pLVar1,&local_b8,x,-c,&local_50);
    break;
  case IRT_NE:
    this = (LinearNE<0,_1,_1> *)operator_new(0x58);
    local_60.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_60.v = r->v;
    local_60.s = r->s;
    LinearNE<0,_1,_1>::LinearNE(this,a,x,c,&local_60);
    break;
  case IRT_LE:
    local_70.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_70.v = r->v;
    local_70.s = r->s;
    int_linear_imp<0>(&local_b8,x,IRT_GE,-c,&local_70);
    break;
  case IRT_LT:
    local_80.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_80.v = r->v;
    local_80.s = r->s;
    int_linear_imp<0>(&local_b8,x,IRT_GE,1 - c,&local_80);
    break;
  case IRT_GE:
    pLVar1 = (LinearGE<0,_1> *)operator_new(0x88);
    local_90.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_90.v = r->v;
    local_90.s = r->s;
    LinearGE<0,_1>::LinearGE(pLVar1,a,x,c,&local_90);
    break;
  case IRT_GT:
    local_a0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
    local_a0.v = r->v;
    local_a0.s = r->s;
    int_linear_imp<0>(a,x,IRT_GE,c + 1,&local_a0);
    break;
  default:
    int_linear_imp<0>();
    operator_delete(a);
    if (local_b8.data != (int *)0x0) {
      free(local_b8.data);
    }
    _Unwind_Resume(extraout_RAX);
  }
  if (local_b8.data != (int *)0x0) {
    free(local_b8.data);
  }
  return;
}

Assistant:

void int_linear_imp(vec<int>& a, vec<IntVar*>& x, IntRelType t, int c, BoolView r) {
	vec<int> b;
	for (unsigned int i = 0; i < a.size(); i++) {
		b.push(-a[i]);
	}
	switch (t) {
		case IRT_EQ:
			new LinearGE<S, 1>(a, x, c, r);
			new LinearGE<S, 1>(b, x, -c, r);
			break;
		case IRT_NE:
			new LinearNE<2 * S, 2 * S + 1, 1>(a, x, c, r);
			break;
		case IRT_LE:
			int_linear_imp<S>(b, x, IRT_GE, -c, r);
			break;
		case IRT_LT:
			int_linear_imp<S>(b, x, IRT_GE, -c + 1, r);
			break;
		case IRT_GE:
			new LinearGE<S, 1>(a, x, c, r);
			break;
		case IRT_GT:
			int_linear_imp<S>(a, x, IRT_GE, c + 1, r);
			break;
		default:
			NEVER;
	}
}